

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * nite::strAt(string *__return_storage_ptr__,string *Input,uint x)

{
  ulong uVar1;
  char *pcVar2;
  allocator local_1d;
  uint local_1c;
  string *psStack_18;
  uint x_local;
  string *Input_local;
  string *output;
  
  local_1c = x;
  psStack_18 = Input;
  Input_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::length();
  if (uVar1 < x) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psStack_18);
    pcVar2 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,*pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

String nite::strAt(const String &Input, unsigned x){
	if (x>Input.length())
		return "";
	String output = Input;
	output = output.at(x);
	return output;
}